

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilMisc.c
# Opt level: O3

int * Extra_DeriveRadixCode(int Number,int Radix,int nDigits)

{
  ulong uVar1;
  int iVar2;
  long lVar3;
  
  if (99 < nDigits) {
    __assert_fail("nDigits < 100",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                  ,0xa5,"int *Extra_DeriveRadixCode(int, int, int)");
  }
  uVar1 = (ulong)(uint)Number;
  if (0 < nDigits) {
    lVar3 = 0;
    do {
      iVar2 = (int)uVar1;
      uVar1 = (long)iVar2 / (long)Radix;
      Number = (int)uVar1;
      *(int *)((long)Extra_DeriveRadixCode::Code + lVar3) = iVar2 % Radix;
      lVar3 = lVar3 + 4;
    } while ((ulong)(uint)nDigits << 2 != lVar3);
  }
  if (Number == 0) {
    return Extra_DeriveRadixCode::Code;
  }
  __assert_fail("Number == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/extra/extraUtilMisc.c"
                ,0xab,"int *Extra_DeriveRadixCode(int, int, int)");
}

Assistant:

int * Extra_DeriveRadixCode( int Number, int Radix, int nDigits )
{
    static int Code[100];
    int i;
    assert( nDigits < 100 );
    for ( i = 0; i < nDigits; i++ )
    {
        Code[i] = Number % Radix;
        Number  = Number / Radix;
    }
    assert( Number == 0 );
    return Code;
}